

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firm_update.c
# Opt level: O1

int input_bin(char *fname,int *length)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = fgetc(__stream);
    if (iVar1 == -1) {
      uVar3 = 0;
    }
    else {
      uVar2 = 0;
      do {
        uVar3 = uVar2 + 1;
        filebuffer[uVar2] = (char)iVar1;
        iVar1 = fgetc(__stream);
        if (iVar1 == -1) break;
        bVar4 = uVar2 < 0x7fffff;
        uVar2 = uVar3;
      } while (bVar4);
    }
    *length = (int)uVar3;
    fclose(__stream);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int input_bin(char *fname, int *length)
{
    FILE *fp;
 
	int cc = 0, c;

    fp = fopen(fname, "rb");
    if(fp == NULL) 
        return 0;
	while (((c = fgetc(fp)) != EOF) && (cc < FWBUFSIZE))
		filebuffer[cc++] = (uint8)c;
	*length = cc;
	fclose(fp);
	return 1;
}